

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

Vec_Int_t * Gia_ManCollectTruthTables(Gia_Man_t *p,Vec_Int_t *vFadds)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int Truth;
  int pCut [4];
  int local_4c;
  int local_48 [6];
  
  local_48[0] = 3;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  iVar2 = vFadds->nSize * 2;
  iVar1 = iVar2 >> 0x1f;
  iVar2 = iVar2 / 5 + iVar1;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < (iVar2 - iVar1) - 1U) {
    iVar4 = iVar2 - iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar3;
  Gia_ManCleanValue(p);
  iVar2 = vFadds->nSize;
  if (4 < iVar2) {
    lVar6 = 0;
    lVar8 = 0;
    do {
      lVar5 = 1;
      lVar7 = lVar6;
      do {
        if (iVar2 <= lVar7) goto LAB_005da7f7;
        local_48[lVar5] = vFadds->pArray[lVar7];
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      iVar1 = (int)lVar8 * 5;
      if (iVar2 <= iVar1 + 3) {
LAB_005da7f7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = Dtc_ObjComputeTruth(p,vFadds->pArray[lVar8 * 5 + 3],local_48,&local_4c);
      if (iVar2 != 1) {
        __assert_fail("Type == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x25f,"Vec_Int_t *Gia_ManCollectTruthTables(Gia_Man_t *, Vec_Int_t *)");
      }
      Vec_IntPush(p_00,local_4c);
      if (vFadds->nSize <= iVar1 + 4) goto LAB_005da7f7;
      iVar2 = Dtc_ObjComputeTruth(p,vFadds->pArray[lVar8 * 5 + 4],local_48,&local_4c);
      if (iVar2 != 2) {
        __assert_fail("Type == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x262,"Vec_Int_t *Gia_ManCollectTruthTables(Gia_Man_t *, Vec_Int_t *)");
      }
      Vec_IntPush(p_00,local_4c);
      lVar8 = lVar8 + 1;
      iVar2 = vFadds->nSize;
      lVar6 = lVar6 + 5;
    } while (lVar8 < iVar2 / 5);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManCollectTruthTables( Gia_Man_t * p, Vec_Int_t * vFadds )
{
    int i, k, Type, Truth, pCut[4] = {3};
    Vec_Int_t * vTruths = Vec_IntAlloc( 2*Vec_IntSize(vFadds)/5 );
    Gia_ManCleanValue( p );
    Dtc_ForEachFadd( vFadds, i )
    {
        for ( k = 0; k < 3; k++ )
            pCut[k+1] = Vec_IntEntry( vFadds, 5*i+k );
        Type = Dtc_ObjComputeTruth( p, Vec_IntEntry(vFadds, 5*i+3), pCut, &Truth );
        assert( Type == 1 );
        Vec_IntPush( vTruths, Truth );
        Type = Dtc_ObjComputeTruth( p, Vec_IntEntry(vFadds, 5*i+4), pCut, &Truth );
        assert( Type == 2 );
        Vec_IntPush( vTruths, Truth );
    }
    return vTruths;
}